

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Read<long> __thiscall
Omega_h::coalesce<long>
          (Omega_h *this,vector<Omega_h::Read<long>,_std::allocator<Omega_h::Read<long>_>_> *arrays)

{
  LO size_in;
  value_type vVar1;
  ulong *puVar2;
  ulong uVar3;
  void *in_RDX;
  ulong *puVar4;
  void *extraout_RDX;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  Read<long> RVar8;
  Write<long> out;
  Write<int> local_90;
  value_type array;
  type f;
  vector<int,_std::allocator<int>_> offsets;
  
  if (*(long *)arrays == *(long *)(arrays + 8)) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector
              (&offsets,(*(long *)(arrays + 8) - *(long *)arrays >> 4) + 1,(allocator_type *)&f);
    if (offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) {
      fail("assertion %s failed at %s +%d\n","offsets.data() != nullptr",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
           ,0x1c2);
    }
    *offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = 0;
    puVar4 = *(ulong **)arrays;
    uVar3 = *(long *)(arrays + 8) - (long)puVar4 >> 4;
    for (uVar5 = 1; puVar4 = puVar4 + 2, uVar5 <= uVar3; uVar5 = uVar5 + 1) {
      puVar2 = (ulong *)*puVar4;
      if (((ulong)puVar2 & 1) == 0) {
        uVar6 = *puVar2;
      }
      else {
        uVar6 = (ulong)puVar2 >> 3;
      }
      offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar5] = (int)(uVar6 >> 3) +
                offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5 - 1];
    }
    size_in = offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar3];
    std::__cxx11::string::string((string *)&f,"",(allocator *)&array);
    Write<long>::Write(&out,size_in,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    lVar7 = 0;
    for (uVar5 = 0; uVar5 < (ulong)(*(long *)(arrays + 8) - *(long *)arrays >> 4); uVar5 = uVar5 + 1
        ) {
      Write<long>::Write((Write<int> *)&array,(Write<int> *)(*(long *)arrays + lVar7));
      vVar1 = offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar5];
      Write<long>::Write((Write<int> *)&f,(Write<int> *)&out);
      f.offset = vVar1;
      Write<long>::Write((Write<int> *)&f.array,(Write<int> *)&array);
      if (((ulong)array.write_.shared_alloc_.alloc & 1) == 0) {
        uVar3 = (array.write_.shared_alloc_.alloc)->size;
      }
      else {
        uVar3 = (ulong)array.write_.shared_alloc_.alloc >> 3;
      }
      parallel_for<Omega_h::coalesce<long>(std::vector<Omega_h::Read<long>,std::allocator<Omega_h::Read<long>>>)::_lambda(int)_1_>
                ((LO)(uVar3 >> 3),&f,"coalesce");
      coalesce<long>(std::vector<Omega_h::Read<long>,std::allocator<Omega_h::Read<long>>>)::
      {lambda(int)#1}::~vector((_lambda_int__1_ *)&f);
      Write<long>::~Write((Write<long> *)&array);
      lVar7 = lVar7 + 0x10;
    }
    Write<long>::Write(&local_90,(Write<int> *)&out);
    Read<long>::Read((Read<signed_char> *)this,(Write<long> *)&local_90);
    Write<long>::~Write((Write<long> *)&local_90);
    Write<long>::~Write(&out);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&offsets.super__Vector_base<int,_std::allocator<int>_>);
    in_RDX = extraout_RDX;
  }
  RVar8.write_.shared_alloc_.direct_ptr = in_RDX;
  RVar8.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<long>)RVar8.write_.shared_alloc_;
}

Assistant:

Read<T> coalesce(std::vector<Read<T>> arrays) {
  if (arrays.empty()) return Read<T>();
  std::vector<LO> offsets(arrays.size() + 1);
  OMEGA_H_CHECK(offsets.data() != nullptr);
  offsets[0] = 0;
  for (std::size_t i = 1; i <= arrays.size(); ++i) {
    offsets[i] = offsets[i - 1] + arrays[i].size();
  }
  auto out_size = offsets[arrays.size()];
  auto out = Write<T>(out_size);
  for (std::size_t i = 0; i < arrays.size(); ++i) {
    auto array = arrays[std::size_t(i)];
    auto offset = offsets[i];
    auto f = OMEGA_H_LAMBDA(LO j) { out[offset + j] = array[j]; };
    parallel_for(array.size(), f, "coalesce");
  }
  return out;
}